

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O2

uint64_t pack_mode1_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint8_t *pSelectors)

{
  long lVar1;
  long lVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  undefined8 in_RAX;
  uint64_t uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint64_t uVar12;
  undefined8 uStack_40;
  undefined7 uStack_38;
  color_quad_u8 p;
  
  uVar8 = 0xffffffff;
  uVar10 = 0;
  uVar9 = 0;
  do {
    uVar11 = (uint)uVar9;
    if (uVar10 == 2) {
LAB_00108e5d:
      uVar9 = (ulong)uVar11;
      lVar6 = (ulong)r * 8;
      lVar1 = (ulong)g * 8;
      lVar2 = (ulong)b * 8;
      uVar3 = *(uint8_t *)(lVar1 + 0x1661a2 + uVar9 * 4);
      uVar4 = *(uint8_t *)(lVar2 + 0x1661a2 + uVar9 * 4);
      (pResults->m_low_endpoint).m_c[0] = *(uint8_t *)(lVar6 + 0x1661a2 + uVar9 * 4);
      (pResults->m_low_endpoint).m_c[1] = uVar3;
      (pResults->m_low_endpoint).m_c[2] = uVar4;
      (pResults->m_low_endpoint).m_c[3] = '\0';
      uVar3 = *(uint8_t *)(lVar1 + 0x1661a3 + uVar9 * 4);
      uVar4 = *(uint8_t *)(lVar2 + 0x1661a3 + uVar9 * 4);
      (pResults->m_high_endpoint).m_c[0] = *(uint8_t *)(lVar6 + 0x1661a3 + uVar9 * 4);
      (pResults->m_high_endpoint).m_c[1] = uVar3;
      (pResults->m_high_endpoint).m_c[2] = uVar4;
      (pResults->m_high_endpoint).m_c[3] = '\0';
      pResults->m_pbits[0] = uVar11;
      pResults->m_pbits[1] = 0;
      uStack_40 = 0x108ebe;
      _uStack_38 = in_RAX;
      memset(pSelectors,2,(ulong)pParams->m_num_pixels);
      uVar8 = pResults->m_pbits[0] * 2;
      for (lVar6 = 8; lVar6 != 0xb; lVar6 = lVar6 + 1) {
        uVar11 = (uint)*(byte *)((long)&((color_cell_compressor_results *)
                                        (&pResults->m_low_endpoint + -2))->m_best_overall_err +
                                lVar6) << 2 | uVar8;
        uVar7 = (uint)*(byte *)((long)(&pResults->m_low_endpoint + -1) + lVar6) << 2 | uVar8;
        *(char *)((long)&uStack_40 + lVar6 + 4) =
             (char)((uVar11 >> 7 | uVar11) * 0x2e + (uVar7 >> 7 | uVar7) * 0x12 + 0x20 >> 6);
      }
      _uStack_38 = CONCAT17(0xff,uStack_38);
      uVar8 = pParams->m_num_pixels;
      uVar12 = 0;
      for (lVar6 = 0; (ulong)uVar8 << 2 != lVar6; lVar6 = lVar6 + 4) {
        uStack_40 = 0x108f3c;
        uVar5 = compute_color_distance_rgb
                          (&p,(color_quad_u8 *)(pParams->m_pPixels->m_c + lVar6),
                           pParams->m_perceptual,pParams->m_weights);
        uVar12 = uVar12 + uVar5;
      }
      pResults->m_best_overall_err = uVar12;
      return uVar12;
    }
    uVar11 = (uint)g_bc7_mode_1_optimal_endpoints[b][uVar10].m_error +
             (uint)g_bc7_mode_1_optimal_endpoints[g][uVar10].m_error +
             (uint)g_bc7_mode_1_optimal_endpoints[r][uVar10].m_error;
    if (uVar11 < uVar8) {
      if (uVar11 == 0) {
        uVar11 = (uint)uVar10;
        goto LAB_00108e5d;
      }
      uVar9 = uVar10 & 0xffffffff;
      uVar8 = uVar11;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static uint64_t pack_mode1_to_one_color(const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, uint32_t r, uint32_t g, uint32_t b, uint8_t *pSelectors)
{
	uint32_t best_err = UINT_MAX;
	uint32_t best_p = 0;

	for (uint32_t p = 0; p < 2; p++)
	{
		uint32_t err = g_bc7_mode_1_optimal_endpoints[r][p].m_error + g_bc7_mode_1_optimal_endpoints[g][p].m_error + g_bc7_mode_1_optimal_endpoints[b][p].m_error;
		if (err < best_err)
		{
			best_err = err;
			best_p = p;
			if (!best_err)
				break;
		}
	}

	const endpoint_err *pEr = &g_bc7_mode_1_optimal_endpoints[r][best_p];
	const endpoint_err *pEg = &g_bc7_mode_1_optimal_endpoints[g][best_p];
	const endpoint_err *pEb = &g_bc7_mode_1_optimal_endpoints[b][best_p];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, 0);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, 0);
	pResults->m_pbits[0] = best_p;
	pResults->m_pbits[1] = 0;

	memset(pSelectors, BC7ENC_MODE_1_OPTIMAL_INDEX, pParams->m_num_pixels);

	color_quad_u8 p;
	for (uint32_t i = 0; i < 3; i++)
	{
		uint32_t low = ((pResults->m_low_endpoint.m_c[i] << 1) | pResults->m_pbits[0]) << 1;
		low |= (low >> 7);

		uint32_t high = ((pResults->m_high_endpoint.m_c[i] << 1) | pResults->m_pbits[0]) << 1;
		high |= (high >> 7);

		p.m_c[i] = (uint8_t)((low * (64 - g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX]) + high * g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX] + 32) >> 6);
	}
	p.m_c[3] = 255;

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		total_err += compute_color_distance_rgb(&p, &pParams->m_pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}